

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O2

Ref<embree::SceneGraph::LightNode> __thiscall
embree::SceneGraph::LightNodeImpl<embree::SceneGraph::SpotLight>::lerp
          (LightNodeImpl<embree::SceneGraph::SpotLight> *this,
          Ref<embree::SceneGraph::LightNode> *light1_in,float f)

{
  bool bVar1;
  long *plVar2;
  LightNodeImpl<embree::SceneGraph::SpotLight> *this_00;
  long *in_RDX;
  long *plVar3;
  SpotLight local_78;
  
  bVar1 = true;
  if (*in_RDX == 0) {
    plVar3 = (long *)0x0;
  }
  else {
    plVar2 = (long *)__dynamic_cast(*in_RDX,&LightNode::typeinfo,&typeinfo,0);
    plVar3 = (long *)0x0;
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 0x10))(plVar2);
      bVar1 = false;
      plVar3 = plVar2;
    }
  }
  this_00 = (LightNodeImpl<embree::SceneGraph::SpotLight> *)operator_new(0xc0);
  SpotLight::lerp(&local_78,(SpotLight *)(light1_in + 0xe),(SpotLight *)(plVar3 + 0xe),f);
  LightNodeImpl(this_00,&local_78);
  (this->super_LightNode).super_Node.super_RefCount._vptr_RefCount = (_func_int **)this_00;
  (*(this_00->super_LightNode).super_Node.super_RefCount._vptr_RefCount[2])(this_00);
  if (!bVar1) {
    (**(code **)(*plVar3 + 0x18))(plVar3);
  }
  return (Ref<embree::SceneGraph::LightNode>)&this->super_LightNode;
}

Assistant:

virtual Ref<LightNode> lerp(const Ref<LightNode>& light1_in, float f) const
      {
        const Ref<LightNodeImpl<Light>> light1 = light1_in.dynamicCast<LightNodeImpl<Light>>();
        assert(light1);
        return new LightNodeImpl(Light::lerp(light,light1->light,f));
      }